

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmProjectDirectoryListGenerator *gen,cmCaseInsensitiveDirectoryListGenerator *tail,
               cmProjectDirectoryListGenerator *tail_1)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar1;
  bool bVar2;
  string path_1;
  string path;
  bool local_a9;
  string local_a8;
  string local_88;
  string *local_68;
  cmProjectDirectoryListGenerator *local_60;
  anon_class_8_1_8991fb9c *local_58;
  string local_50;
  
  local_58 = filesCollector;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(gen->super_cmDirectoryListGenerator).Matches,
                    (gen->super_cmDirectoryListGenerator).Matches.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (gen->super_cmDirectoryListGenerator).Current._M_current =
       (gen->super_cmDirectoryListGenerator).Matches.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68 = startPath;
  local_60 = gen;
  anon_unknown.dwarf_da4def::cmDirectoryListGenerator::GetNextCandidate
            (&local_88,&gen->super_cmDirectoryListGenerator,startPath);
  local_a9 = local_88._M_string_length != 0;
  if (local_a9) {
    this = &(tail_1->super_cmDirectoryListGenerator).Matches;
    do {
      tail->Loaded = false;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(this,(tail_1->super_cmDirectoryListGenerator).Matches.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      (tail_1->super_cmDirectoryListGenerator).Current._M_current =
           (tail_1->super_cmDirectoryListGenerator).Matches.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      tail->Loaded = false;
      anon_unknown.dwarf_da4def::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
                (&local_a8,tail,&local_88);
      bVar2 = local_a8._M_string_length != 0;
      if (bVar2) {
        bVar2 = true;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(this,(tail_1->super_cmDirectoryListGenerator).Matches.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          (tail_1->super_cmDirectoryListGenerator).Current._M_current =
               (tail_1->super_cmDirectoryListGenerator).Matches.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          bVar1 = TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                            (local_58,&local_a8,tail_1);
          if (bVar1) break;
          anon_unknown.dwarf_da4def::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
                    (&local_50,tail,&local_88);
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          bVar2 = local_a8._M_string_length != 0;
        } while (bVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) break;
      anon_unknown.dwarf_da4def::cmDirectoryListGenerator::GetNextCandidate
                (&local_a8,&local_60->super_cmDirectoryListGenerator,local_68);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a9 = local_88._M_string_length != 0;
    } while (local_a9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return local_a9;
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}